

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O0

void __thiscall Js::JavascriptMap::Set(JavascriptMap *this,Var key,Var value)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  ScriptContext *this_00;
  ThreadContext *threadContext;
  undefined4 *puVar4;
  undefined1 local_40 [8];
  JsReentLock jsReentLock;
  Var value_local;
  Var key_local;
  JavascriptMap *this_local;
  
  jsReentLock._24_8_ = value;
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  threadContext = ScriptContext::GetThreadContext(this_00);
  JsReentLock::JsReentLock((JsReentLock *)local_40,threadContext);
  TVar1 = this->kind;
  if (TVar1 == EmptyMap) {
    SetOnEmptyMap(this,key,(Var)jsReentLock._24_8_);
  }
  else if (TVar1 == SimpleVarMap) {
    bVar3 = TrySetOnSimpleVarMap(this,key,(Var)jsReentLock._24_8_);
    if (!bVar3) {
      PromoteToComplexVarMap(this);
      Set(this,key,(Var)jsReentLock._24_8_);
    }
  }
  else if (TVar1 == ComplexVarMap) {
    SetOnComplexVarMap(this,key,(Var)jsReentLock._24_8_);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMap.cpp"
                                ,600,"((0))","(0)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  JsReentLock::~JsReentLock((JsReentLock *)local_40);
  return;
}

Assistant:

void
JavascriptMap::Set(Var key, Var value)
{
    JS_REENTRANCY_LOCK(jsReentLock, this->GetScriptContext()->GetThreadContext());

    switch (this->kind)
    {
    case MapKind::EmptyMap:
        this->SetOnEmptyMap(key, value);
        return;

    case MapKind::SimpleVarMap:
        if (this->TrySetOnSimpleVarMap(key, value))
        {
            return;
        }
        this->PromoteToComplexVarMap();
        return this->Set(key, value);

    case MapKind::ComplexVarMap:
        this->SetOnComplexVarMap(key, value);
        return;

    default:
        Assume(UNREACHED);
    }
}